

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void __thiscall aiNode::addChildren(aiNode *this,uint numChildren,aiNode **children)

{
  uint uVar1;
  ulong uVar2;
  void *__dest;
  aiNode **ppaVar3;
  ulong uVar4;
  
  if (numChildren != 0 && children != (aiNode **)0x0) {
    uVar4 = (ulong)numChildren;
    uVar2 = 0;
    do {
      if (children[uVar2] != (aiNode *)0x0) {
        children[uVar2]->mParent = this;
      }
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
    if ((ulong)this->mNumChildren != 0) {
      uVar2 = (ulong)this->mNumChildren << 3;
      __dest = operator_new__(uVar2);
      ppaVar3 = this->mChildren;
      memcpy(__dest,ppaVar3,uVar2);
      if (ppaVar3 != (aiNode **)0x0) {
        operator_delete__(ppaVar3);
      }
      uVar1 = this->mNumChildren;
      ppaVar3 = (aiNode **)operator_new__((ulong)(numChildren + uVar1) * 8);
      this->mChildren = ppaVar3;
      memcpy(ppaVar3,__dest,(ulong)uVar1 * 8);
      memcpy(ppaVar3 + uVar1,children,uVar4 << 3);
      this->mNumChildren = numChildren + uVar1;
      operator_delete__(__dest);
      return;
    }
    ppaVar3 = (aiNode **)operator_new__(uVar4 * 8);
    this->mChildren = ppaVar3;
    if (numChildren != 0) {
      uVar2 = 0;
      do {
        this->mChildren[uVar2] = children[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    this->mNumChildren = numChildren;
  }
  return;
}

Assistant:

void aiNode::addChildren(unsigned int numChildren, aiNode **children) {
    if (nullptr == children || 0 == numChildren) {
        return;
    }

    for (unsigned int i = 0; i < numChildren; i++) {
        aiNode *child = children[i];
        if (nullptr != child) {
            child->mParent = this;
        }
    }

    if (mNumChildren > 0) {
        aiNode **tmp = new aiNode*[mNumChildren];
        ::memcpy(tmp, mChildren, sizeof(aiNode*) * mNumChildren);
        delete[] mChildren;
        mChildren = new aiNode*[mNumChildren + numChildren];
        ::memcpy(mChildren, tmp, sizeof(aiNode*) * mNumChildren);
        ::memcpy(&mChildren[mNumChildren], children, sizeof(aiNode*)* numChildren);
        mNumChildren += numChildren;
        delete[] tmp;
    }
    else {
        mChildren = new aiNode*[numChildren];
        for (unsigned int i = 0; i < numChildren; i++) {
            mChildren[i] = children[i];
        }
        mNumChildren = numChildren;
    }
}